

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_InitProto<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  Var value;
  Var value_00;
  PropertyId propertyId;
  
  value = *(Var *)(this + (ulong)playout->Instance * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
  value_00 = *(Var *)(this + (ulong)playout->Value * 8 + 0x160);
  ValidateRegValue(this,value_00,false,true);
  JavascriptOperators::OP_InitProto(value,propertyId,value_00);
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitProto(const unaligned T * playout)
    {
        JavascriptOperators::OP_InitProto(GetReg(playout->Instance), m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetReg(playout->Value));
    }